

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signal_PDU.cpp
# Opt level: O2

void __thiscall KDIS::PDU::Signal_PDU::SetData(Signal_PDU *this,KOCTET *D,KUINT16 Length)

{
  vector<char,_std::allocator<char>_> *this_00;
  KUINT16 *pKVar1;
  pointer pcVar2;
  short sVar3;
  ulong uVar4;
  KUINT8 i;
  byte bVar5;
  char local_29;
  
  (this->super_Radio_Communications_Header).super_Header.super_Header6.m_ui16PDULength = 0x20;
  this_00 = &this->m_vData;
  pcVar2 = (this->m_vData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_vData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish != pcVar2) {
    (this->m_vData).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = pcVar2;
  }
  uVar4 = (ulong)(Length >> 3);
  std::vector<char,_std::allocator<char>_>::reserve(this_00,uVar4);
  while (sVar3 = (short)uVar4, uVar4 = (ulong)(ushort)(sVar3 - 1), sVar3 != 0) {
    std::vector<char,_std::allocator<char>_>::push_back(this_00,D);
    D = D + 1;
  }
  uVar4 = (long)(this->m_vData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->m_vData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start;
  sVar3 = (short)uVar4;
  this->m_ui16DataLength = sVar3 * 8;
  if ((uVar4 & 3) != 0) {
    for (bVar5 = 0; bVar5 < (byte)(4 - ((byte)uVar4 & 3)); bVar5 = bVar5 + 1) {
      local_29 = '\0';
      std::vector<char,_std::allocator<char>_>::emplace_back<char>(this_00,&local_29);
    }
    sVar3 = (short)(this->m_vData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
            (short)(this->m_vData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
  }
  pKVar1 = &(this->super_Radio_Communications_Header).super_Header.super_Header6.m_ui16PDULength;
  *pKVar1 = *pKVar1 + sVar3;
  return;
}

Assistant:

void Signal_PDU::SetData( const KOCTET * D, KUINT16 Length )
{
    // If we already have data clear it first.
    m_ui16PDULength = SIGNAL_PDU_SIZE;
    m_vData.clear();

    // Copy data into the vector
    KUINT16 uiDataSz = Length / 8;
    m_vData.reserve( uiDataSz );
    for( KUINT16 i = 0; i < uiDataSz; ++i, ++D )
    {
        m_vData.push_back( *D );
    }

    // Data length does not include the padding
    m_ui16DataLength = m_vData.size() * 8;

    // Do we need to apply padding, the PDU size should be a multiple
    // of 32 bits / 4 octets.
    KUINT8 ui8PaddingNeeded = m_vData.size() % 4 == 0 ? 0 : (4 - m_vData.size() % 4); // Add padding;
    for( KUINT8 i = 0; i < ui8PaddingNeeded; ++ i )
    {
        m_vData.push_back( 0 );
    }

    // Update lengths
    m_ui16PDULength += m_vData.size();
}